

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyVertices
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_00;
  QGraphicsLayoutItem *pQVar1;
  qsizetype qVar2;
  bool bVar3;
  bool bVar4;
  AnchorData *pAVar5;
  parameter_type t;
  undefined1 *puVar6;
  AnchorVertex *pAVar7;
  long lVar8;
  int i_1;
  int i;
  ulong uVar9;
  long in_FS_OFFSET;
  AnchorVertex *adjacent;
  parameter_type local_c8;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_c0;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_a8;
  AnchorVertex *next;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_88;
  AnchorVertex *v;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> local_60;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  lVar8 = (long)(int)orientation;
  this_00 = (this->graph).m_data + lVar8 + -1;
  local_58.d = (Data *)0x0;
  local_58.ptr = (AnchorVertex **)0x0;
  local_58.size = 0;
  QStack<QtGraphicsAnchorLayout::AnchorVertex_*>::push
            ((QStack<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_58,
             (AnchorVertex **)((this->graph).m_data + lVar8 + 1));
  local_60.d = (Data *)0x0;
  do {
    qVar2 = local_58.size;
    if (local_58.size == 0) {
LAB_0055c477:
      QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::~QHash(&local_60);
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return qVar2 == 0;
    }
    v = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::takeLast
                  ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_58);
    QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
              ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_88,(AnchorVertex **)&local_60)
    ;
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
    adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_88,this_00,v);
    puVar6 = (undefined1 *)0x0;
    while( true ) {
      if ((ulong)local_88.size <= puVar6) break;
      next = local_88.ptr[(long)puVar6];
      pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData(this_00,v,next);
      pAVar7 = v;
      if (v->m_item == pQVar1) {
        bVar3 = next->m_item == pQVar1;
      }
      else {
        bVar3 = false;
      }
      if (((pAVar5->minSize != 0.0) || (NAN(pAVar5->minSize))) || (bVar3 || pAVar5->maxSize != 0.0))
      {
        bVar3 = QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::contains
                          (&local_60,&next);
        if ((!bVar3) &&
           (bVar3 = QListSpecialMethodsBase<QtGraphicsAnchorLayout::AnchorVertex*>::
                    contains<QtGraphicsAnchorLayout::AnchorVertex*>
                              ((QListSpecialMethodsBase<QtGraphicsAnchorLayout::AnchorVertex*> *)
                               &local_58,&next), !bVar3)) {
          QList<QtGraphicsAnchorLayout::AnchorVertex_*>::append
                    ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_58,next);
        }
      }
      else {
        t = (parameter_type)operator_new(0x68);
        (t->super_AnchorVertex).m_item = (QGraphicsLayoutItem *)0x0;
        (t->super_AnchorVertex).m_edge = AnchorLeft;
        (t->super_AnchorVertex)._vptr_AnchorVertex = (_func_int **)&PTR__AnchorVertexPair_007eb208;
        t->m_first = pAVar7;
        t->m_second = next;
        t->m_removedAnchor = pAVar5;
        (t->m_secondAnchors).d.ptr = (AnchorData **)0x0;
        (t->m_secondAnchors).d.size = 0;
        (t->m_firstAnchors).d.size = 0;
        (t->m_secondAnchors).d.d = (Data *)0x0;
        (t->m_firstAnchors).d.d = (Data *)0x0;
        (t->m_firstAnchors).d.ptr = (AnchorData **)0x0;
        QList<QtGraphicsAnchorLayout::AnchorVertexPair_*>::append
                  ((QList<QtGraphicsAnchorLayout::AnchorVertexPair_*> *)
                   ((long)&this->layoutCentralVertex + lVar8 * 0x18 + 8),t);
        Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
        adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_a8,this_00,v);
        Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
        adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_c0,this_00,next);
        for (uVar9 = 0; uVar9 < (ulong)local_a8.size; uVar9 = uVar9 + 1) {
          if (local_a8.ptr[uVar9] != next) {
            pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                     ::edgeData(this_00,v,local_a8.ptr[uVar9]);
            QList<QtGraphicsAnchorLayout::AnchorData_*>::append(&t->m_firstAnchors,pAVar5);
          }
        }
        for (uVar9 = 0; uVar9 < (ulong)local_c0.size; uVar9 = uVar9 + 1) {
          adjacent = local_c0.ptr[uVar9];
          if (adjacent != v) {
            pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                     ::edgeData(this_00,next,adjacent);
            QList<QtGraphicsAnchorLayout::AnchorData_*>::append(&t->m_secondAnchors,pAVar5);
            bVar3 = QListSpecialMethodsBase<QtGraphicsAnchorLayout::AnchorVertex*>::
                    contains<QtGraphicsAnchorLayout::AnchorVertex*>
                              ((QListSpecialMethodsBase<QtGraphicsAnchorLayout::AnchorVertex*> *)
                               &local_88,&adjacent);
            if (!bVar3) {
              QList<QtGraphicsAnchorLayout::AnchorVertex_*>::append
                        ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_88,adjacent);
            }
          }
        }
        bVar3 = replaceVertex(this,orientation,v,(AnchorVertex *)t,&t->m_firstAnchors);
        bVar4 = replaceVertex(this,orientation,next,(AnchorVertex *)t,&t->m_secondAnchors);
        pAVar7 = v;
        if ((v->m_item == pQVar1) || (pAVar7 = next, next->m_item == pQVar1)) {
          (t->super_AnchorVertex).m_item = pQVar1;
          changeLayoutVertex(this,orientation,pAVar7,(AnchorVertex *)t);
        }
        Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::takeEdge
                  (this_00,v,next);
        if (!bVar3 || !bVar4) {
          QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_c0);
          QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_a8);
          QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_88);
          goto LAB_0055c477;
        }
        local_c8 = t;
        v = (AnchorVertex *)t;
        QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
                  ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)&adjacent,
                   (AnchorVertex **)&local_60);
        QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_a8);
      }
      puVar6 = puVar6 + 1;
    }
    QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_88);
  } while( true );
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyVertices(Qt::Orientation orientation)
{
    Q_Q(QGraphicsAnchorLayout);
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];

    // We'll walk through vertices
    QStack<AnchorVertex *> stack;
    stack.push(layoutFirstVertex[orientation]);
    QSet<AnchorVertex *> visited;

    while (!stack.isEmpty()) {
        AnchorVertex *v = stack.pop();
        visited.insert(v);

        // Each adjacent of 'v' is a possible vertex to be merged. So we traverse all of
        // them. Since once a merge is made, we might add new adjacents, and we don't want to
        // pass two times through one adjacent. The 'index' is used to track our position.
        QList<AnchorVertex *> adjacents = g.adjacentVertices(v);
        int index = 0;

        while (index < adjacents.size()) {
            AnchorVertex *next = adjacents.at(index);
            index++;

            AnchorData *data = g.edgeData(v, next);
            const bool bothLayoutVertices = v->m_item == q && next->m_item == q;
            const bool zeroSized = !data->minSize && !data->maxSize;

            if (!bothLayoutVertices && zeroSized) {

                // Create a new vertex pair, note that we keep a list of those vertices so we can
                // easily process them when restoring the graph.
                AnchorVertexPair *newV = new AnchorVertexPair(v, next, data);
                simplifiedVertices[orientation].append(newV);

                // Collect the anchors of both vertices, the new vertex pair will take their place
                // in those anchors
                const QList<AnchorVertex *> &vAdjacents = g.adjacentVertices(v);
                const QList<AnchorVertex *> &nextAdjacents = g.adjacentVertices(next);

                for (int i = 0; i < vAdjacents.size(); ++i) {
                    AnchorVertex *adjacent = vAdjacents.at(i);
                    if (adjacent != next) {
                        AnchorData *ad = g.edgeData(v, adjacent);
                        newV->m_firstAnchors.append(ad);
                    }
                }

                for (int i = 0; i < nextAdjacents.size(); ++i) {
                    AnchorVertex *adjacent = nextAdjacents.at(i);
                    if (adjacent != v) {
                        AnchorData *ad = g.edgeData(next, adjacent);
                        newV->m_secondAnchors.append(ad);

                        // We'll also add new vertices to the adjacent list of the new 'v', to be
                        // created as a vertex pair and replace the current one.
                        if (!adjacents.contains(adjacent))
                            adjacents.append(adjacent);
                    }
                }

                // ### merge this loop into the ones that calculated m_firstAnchors/m_secondAnchors?
                // Make newV take the place of v and next
                bool feasible = replaceVertex(orientation, v, newV, newV->m_firstAnchors);
                feasible &= replaceVertex(orientation, next, newV, newV->m_secondAnchors);

                // Update the layout vertex information if one of the vertices is a layout vertex.
                AnchorVertex *layoutVertex = nullptr;
                if (v->m_item == q)
                    layoutVertex = v;
                else if (next->m_item == q)
                    layoutVertex = next;

                if (layoutVertex) {
                    // Layout vertices always have m_item == q...
                    newV->m_item = q;
                    changeLayoutVertex(orientation, layoutVertex, newV);
                }

                g.takeEdge(v, next);

                // If a non-feasibility is found, we leave early and cancel the simplification
                if (!feasible)
                    return false;

                v = newV;
                visited.insert(newV);

            } else if (!visited.contains(next) && !stack.contains(next)) {
                // If the adjacent is not fit for merge and it wasn't visited by the outermost
                // loop, we add it to the stack.
                stack.push(next);
            }
        }
    }

    return true;
}